

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O2

void __thiscall libcalc::Tokenizer::Tokenizer(Tokenizer *this,string *expression)

{
  string local_38;
  
  (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokens).super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_38,(string *)expression);
  parse(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Tokenizer::Tokenizer(std::string expression) {
  parse(expression);
}